

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O0

void png_do_gray_to_rgb(png_row_infop row_info,png_bytep row)

{
  uint uVar1;
  png_byte *ppVar2;
  png_bytep ppVar3;
  png_byte *ppVar4;
  ulong local_68;
  png_bytep local_60;
  png_bytep dp_3;
  png_bytep sp_3;
  png_bytep dp_2;
  png_bytep sp_2;
  png_bytep dp_1;
  png_bytep sp_1;
  png_bytep dp;
  png_bytep sp;
  png_uint_32 row_width;
  png_uint_32 i;
  png_bytep row_local;
  png_row_infop row_info_local;
  
  uVar1 = row_info->width;
  if ((7 < row_info->bit_depth) && ((row_info->color_type & 2) == 0)) {
    if (row_info->color_type == '\0') {
      if (row_info->bit_depth == '\b') {
        sp_1 = row + ((ulong)uVar1 - 1) + (ulong)uVar1 * 2;
        dp = row + ((ulong)uVar1 - 1);
        for (sp._4_4_ = 0; sp._4_4_ < uVar1; sp._4_4_ = sp._4_4_ + 1) {
          *sp_1 = *dp;
          ppVar3 = sp_1 + -2;
          sp_1[-1] = *dp;
          sp_1 = sp_1 + -3;
          *ppVar3 = *dp;
          dp = dp + -1;
        }
      }
      else {
        dp_1 = row + (ulong)uVar1 * 2 + -1;
        sp_2 = dp_1 + (ulong)uVar1 * 4;
        for (sp._4_4_ = 0; sp._4_4_ < uVar1; sp._4_4_ = sp._4_4_ + 1) {
          *sp_2 = *dp_1;
          sp_2[-1] = dp_1[-1];
          sp_2[-2] = *dp_1;
          sp_2[-3] = dp_1[-1];
          ppVar2 = dp_1 + -1;
          ppVar3 = sp_2 + -5;
          sp_2[-4] = *dp_1;
          dp_1 = dp_1 + -2;
          sp_2 = sp_2 + -6;
          *ppVar3 = *ppVar2;
        }
      }
    }
    else if (row_info->color_type == '\x04') {
      if (row_info->bit_depth == '\b') {
        dp_2 = row + (ulong)uVar1 * 2 + -1;
        sp_3 = dp_2 + (ulong)uVar1 * 2;
        for (sp._4_4_ = 0; sp._4_4_ < uVar1; sp._4_4_ = sp._4_4_ + 1) {
          ppVar2 = dp_2 + -1;
          *sp_3 = *dp_2;
          sp_3[-1] = *ppVar2;
          ppVar4 = sp_3 + -3;
          sp_3[-2] = *ppVar2;
          dp_2 = dp_2 + -2;
          sp_3 = sp_3 + -4;
          *ppVar4 = *ppVar2;
        }
      }
      else {
        dp_3 = row + (ulong)uVar1 * 4 + -1;
        local_60 = dp_3 + (ulong)uVar1 * 4;
        for (sp._4_4_ = 0; sp._4_4_ < uVar1; sp._4_4_ = sp._4_4_ + 1) {
          *local_60 = *dp_3;
          ppVar2 = dp_3 + -2;
          local_60[-1] = dp_3[-1];
          local_60[-2] = *ppVar2;
          local_60[-3] = dp_3[-3];
          local_60[-4] = *ppVar2;
          local_60[-5] = dp_3[-3];
          ppVar4 = dp_3 + -3;
          ppVar3 = local_60 + -7;
          local_60[-6] = *ppVar2;
          dp_3 = dp_3 + -4;
          local_60 = local_60 + -8;
          *ppVar3 = *ppVar4;
        }
      }
    }
    row_info->channels = row_info->channels + '\x02';
    row_info->color_type = row_info->color_type | 2;
    row_info->pixel_depth = row_info->channels * row_info->bit_depth;
    if (row_info->pixel_depth < 8) {
      local_68 = (ulong)uVar1 * (ulong)row_info->pixel_depth + 7 >> 3;
    }
    else {
      local_68 = (ulong)uVar1 * (ulong)(row_info->pixel_depth >> 3);
    }
    row_info->rowbytes = local_68;
  }
  return;
}

Assistant:

static void
png_do_gray_to_rgb(png_row_infop row_info, png_bytep row)
{
   png_uint_32 i;
   png_uint_32 row_width = row_info->width;

   png_debug(1, "in png_do_gray_to_rgb");

   if (row_info->bit_depth >= 8 &&
       (row_info->color_type & PNG_COLOR_MASK_COLOR) == 0)
   {
      if (row_info->color_type == PNG_COLOR_TYPE_GRAY)
      {
         if (row_info->bit_depth == 8)
         {
            /* This changes G to RGB */
            png_bytep sp = row + (size_t)row_width - 1;
            png_bytep dp = sp  + (size_t)row_width * 2;
            for (i = 0; i < row_width; i++)
            {
               *(dp--) = *sp;
               *(dp--) = *sp;
               *(dp--) = *(sp--);
            }
         }

         else
         {
            /* This changes GG to RRGGBB */
            png_bytep sp = row + (size_t)row_width * 2 - 1;
            png_bytep dp = sp  + (size_t)row_width * 4;
            for (i = 0; i < row_width; i++)
            {
               *(dp--) = *sp;
               *(dp--) = *(sp - 1);
               *(dp--) = *sp;
               *(dp--) = *(sp - 1);
               *(dp--) = *(sp--);
               *(dp--) = *(sp--);
            }
         }
      }

      else if (row_info->color_type == PNG_COLOR_TYPE_GRAY_ALPHA)
      {
         if (row_info->bit_depth == 8)
         {
            /* This changes GA to RGBA */
            png_bytep sp = row + (size_t)row_width * 2 - 1;
            png_bytep dp = sp  + (size_t)row_width * 2;
            for (i = 0; i < row_width; i++)
            {
               *(dp--) = *(sp--);
               *(dp--) = *sp;
               *(dp--) = *sp;
               *(dp--) = *(sp--);
            }
         }

         else
         {
            /* This changes GGAA to RRGGBBAA */
            png_bytep sp = row + (size_t)row_width * 4 - 1;
            png_bytep dp = sp  + (size_t)row_width * 4;
            for (i = 0; i < row_width; i++)
            {
               *(dp--) = *(sp--);
               *(dp--) = *(sp--);
               *(dp--) = *sp;
               *(dp--) = *(sp - 1);
               *(dp--) = *sp;
               *(dp--) = *(sp - 1);
               *(dp--) = *(sp--);
               *(dp--) = *(sp--);
            }
         }
      }
      row_info->channels = (png_byte)(row_info->channels + 2);
      row_info->color_type |= PNG_COLOR_MASK_COLOR;
      row_info->pixel_depth = (png_byte)(row_info->channels *
          row_info->bit_depth);
      row_info->rowbytes = PNG_ROWBYTES(row_info->pixel_depth, row_width);
   }
}